

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O1

REF_STATUS ref_part_scalar(REF_GRID ref_grid,REF_INT *ldim,REF_DBL **scalar,char *filename)

{
  int *piVar1;
  REF_DBL RVar2;
  int iVar3;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_MPI pRVar4;
  REF_GLOB *pRVar5;
  REF_INT *pRVar6;
  bool bVar7;
  REF_DBL **ppRVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  REF_STATUS RVar12;
  uint uVar13;
  size_t sVar14;
  REF_DBL *pRVar15;
  FILE *pFVar16;
  void *pvVar17;
  REF_LIST pRVar18;
  byte bVar19;
  ulong uVar20;
  undefined8 uVar21;
  int iVar22;
  ulong uVar23;
  long lVar24;
  char *pcVar25;
  undefined8 uVar26;
  REF_LIST pRVar27;
  long lVar28;
  size_t sVar29;
  long lVar30;
  bool bVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  REF_DBL rho;
  REF_DBL v;
  REF_DBL u;
  char letter;
  REF_INT local;
  REF_INT ncell;
  int doubles;
  REF_LONG ref_private_status_reis_ai;
  REF_INT type_1;
  REF_INT length_1;
  REF_INT ntype_1;
  uint64_t count;
  REF_INT version_2;
  int association;
  REF_INT local_resbc;
  REF_INT nodes [27];
  char *local_5c0;
  FILE *local_5b8;
  REF_LIST local_5b0;
  FILE *local_5a8;
  REF_LIST local_5a0;
  REF_LIST local_598;
  REF_DBL **local_590;
  char *local_588;
  undefined1 local_579;
  REF_LIST local_578;
  undefined8 local_570;
  REF_DBL *local_568;
  uint *local_560;
  ulong local_558;
  REF_LIST local_550;
  uint local_548;
  undefined4 uStack_544;
  int local_540 [2];
  uint local_538;
  undefined4 uStack_534;
  REF_INT local_530;
  undefined4 uStack_52c;
  int local_524;
  int local_520;
  int local_51c;
  undefined8 local_518;
  short local_510;
  undefined4 uStack_50e;
  undefined2 uStack_50a;
  double local_508;
  
  ref_node = ref_grid->node;
  sVar14 = strlen(filename);
  if ((sVar14 < 0xd) || (iVar9 = strcmp(filename + (sVar14 - 0xc),".restart_sol"), iVar9 != 0)) {
    if (sVar14 < 5) {
LAB_001974e3:
      if (sVar14 < 6) {
LAB_0019751f:
        if ((sVar14 < 5) || (iVar9 = strcmp(filename + (sVar14 - 4),".plt"), iVar9 != 0)) {
          printf("%s: %d: %s %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0xcce,"input file name extension unknown",filename);
          pcVar25 = "unknown file extension";
          RVar12 = 1;
          uVar21 = 0xcd0;
          local_5c0 = (char *)0x1;
          goto LAB_0019b232;
        }
        pRVar4 = ref_grid->mpi;
        local_5b0 = (REF_LIST)0x0;
        local_598 = (REF_LIST)0x0;
        local_5a0 = (REF_LIST)0x0;
        local_578 = (REF_LIST)0x0;
        local_568 = (REF_DBL *)0x0;
        uVar10 = ref_search_create((REF_SEARCH *)&local_538,ref_node->n);
        if (uVar10 == 0) {
          local_590 = scalar;
          if (0 < ref_node->max) {
            lVar30 = 0;
            lVar28 = 0;
            do {
              if ((-1 < ref_node->global[lVar28]) &&
                 (uVar11 = ref_search_insert((REF_SEARCH)CONCAT44(uStack_534,local_538),
                                             (REF_INT)lVar28,
                                             (REF_DBL *)((long)ref_node->real + lVar30),0.0),
                 uVar11 != 0)) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0xa01,"ref_part_scalar_plt",(ulong)uVar11,"ins");
                goto LAB_001995d7;
              }
              lVar28 = lVar28 + 1;
              lVar30 = lVar30 + 0x78;
            } while (lVar28 < ref_node->max);
          }
          if (pRVar4->id == 0) {
            pFVar16 = fopen(filename,"r");
            if (pFVar16 == (FILE *)0x0) {
              printf("unable to open %s\n",filename);
              pcVar25 = "unable to open file";
              uVar21 = 0xa07;
LAB_00199866:
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,uVar21,"ref_part_scalar_plt",pcVar25);
              uVar11 = 2;
            }
            else {
              uVar11 = ref_list_create(&local_5b0);
              if (uVar11 == 0) {
                uVar11 = ref_list_create(&local_598);
                if (uVar11 == 0) {
                  uVar11 = ref_list_create(&local_5a0);
                  if (uVar11 == 0) {
                    uVar11 = ref_list_create(&local_578);
                    if (uVar11 == 0) {
                      local_5a8 = pFVar16;
                      uVar11 = ref_part_plt_header((FILE *)pFVar16,(REF_INT *)&local_548,local_5b0,
                                                   local_598,local_5a0,local_578);
                      if (uVar11 == 0) {
                        local_530 = local_5a0->n;
                        if (0 < local_598->n) {
                          pRVar6 = local_598->value;
                          lVar28 = 0;
                          bVar31 = false;
                          do {
                            bVar7 = !bVar31;
                            bVar31 = true;
                            if (bVar7) {
                              bVar31 = pRVar6[lVar28] == 1;
                            }
                            pRVar6[lVar28] = 0;
                            lVar28 = lVar28 + 1;
                          } while (lVar28 < local_598->n);
                          if (bVar31) {
                            puts("data packing set to block, was point");
                          }
                        }
                        goto LAB_00198e93;
                      }
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                             ,0xa10,"ref_part_scalar_plt",(ulong)uVar11,"parse header");
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                             ,0xa0c,"ref_part_scalar_plt",(ulong)uVar11,"nelem list");
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0xa0b,"ref_part_scalar_plt",(ulong)uVar11,"nnode list");
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0xa0a,"ref_part_scalar_plt",(ulong)uVar11,"packing list");
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0xa09,"ref_part_scalar_plt",(ulong)uVar11,"zonetype list");
              }
            }
          }
          else {
            local_5a8 = (FILE *)0x0;
LAB_00198e93:
            ppRVar8 = local_590;
            uVar11 = ref_mpi_bcast(pRVar4,&local_548,1,1);
            if (uVar11 == 0) {
              uVar11 = ref_mpi_bcast(pRVar4,&local_530,1,1);
              if (uVar11 == 0) {
                *ldim = local_548 - 3;
                uVar11 = (local_548 - 3) * ref_node->max;
                if ((int)uVar11 < 0) {
                  uVar10 = 1;
                  pcVar25 = "malloc *scalar of REF_DBL negative";
LAB_0019a142:
                  bVar31 = false;
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0xa20,"ref_part_scalar_plt",pcVar25);
                }
                else {
                  pRVar15 = (REF_DBL *)malloc((ulong)uVar11 * 8);
                  *ppRVar8 = pRVar15;
                  if (pRVar15 == (REF_DBL *)0x0) {
                    uVar10 = 2;
                    pcVar25 = "malloc *scalar of REF_DBL NULL";
                    goto LAB_0019a142;
                  }
                  bVar31 = true;
                  if (uVar11 != 0) {
                    uVar20 = 0;
                    do {
                      pRVar15[uVar20] = -999.0;
                      uVar20 = uVar20 + 1;
                    } while (uVar11 != uVar20);
                  }
                }
                uVar11 = uVar10;
                if (bVar31) {
                  uVar11 = ref_list_create((REF_LIST *)&local_570);
                  if (uVar11 == 0) {
                    if (0 < local_530) {
                      iVar9 = 0;
                      local_560 = (uint *)ldim;
                      do {
                        local_588 = (char *)CONCAT44(local_588._4_4_,iVar9);
                        if (pRVar4->id == 0) {
                          uVar11 = ref_part_plt_data((FILE *)local_5a8,local_548,local_5b0,local_598
                                                     ,local_5a0,local_578,local_540,&local_568);
                          if (uVar11 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                   ,0xa27,"ref_part_scalar_plt",(ulong)uVar11,"read data");
                            goto LAB_001995d7;
                          }
                          uVar11 = ref_mpi_bcast(pRVar4,local_540,1,1);
                          if (uVar11 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                   ,0xa28,"ref_part_scalar_plt",(ulong)uVar11,"b length");
                            goto LAB_001995d7;
                          }
                          if (0 < local_540[0]) {
                            uVar13 = ref_mpi_bcast(pRVar4,local_568,local_540[0] * local_548,3);
                            uVar11 = uVar10;
                            if (uVar13 != 0) {
                              uVar21 = 0xa2b;
LAB_0019a3b6:
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                     ,uVar21,"ref_part_scalar_plt",(ulong)uVar13,"b soln");
                              uVar11 = uVar13;
                            }
                            goto LAB_0019a3d2;
                          }
                        }
                        else {
                          uVar11 = ref_mpi_bcast(pRVar4,local_540,1,1);
                          if (uVar11 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                   ,0xa2e,"ref_part_scalar_plt",(ulong)uVar11,"b length");
                            goto LAB_001995d7;
                          }
                          if (local_540[0] < 1) {
                            local_568 = (REF_DBL *)0x0;
                          }
                          else {
                            uVar11 = local_540[0] * local_548;
                            if ((int)uVar11 < 0) {
                              printf("%s: %d: %s: %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                     ,0xa30,"ref_part_scalar_plt","malloc soln of REF_DBL negative")
                              ;
                              uVar11 = 1;
                              goto LAB_001995d7;
                            }
                            local_568 = (REF_DBL *)malloc((ulong)uVar11 << 3);
                            if (local_568 == (REF_DBL *)0x0) {
                              pcVar25 = "malloc soln of REF_DBL NULL";
                              uVar21 = 0xa30;
                              goto LAB_00199866;
                            }
                            uVar13 = ref_mpi_bcast(pRVar4,local_568,uVar11,3);
                            uVar11 = uVar10;
                            if (uVar13 != 0) {
                              uVar21 = 0xa32;
                              goto LAB_0019a3b6;
                            }
LAB_0019a3d2:
                            uVar10 = uVar11;
                            if (uVar13 != 0) goto LAB_001995d7;
                          }
                        }
                        if (0 < local_540[0]) {
                          iVar9 = 0;
                          do {
                            lVar28 = (long)(int)(local_548 * iVar9);
                            if (ref_grid->twod == 0) {
                              lVar30 = 0;
                              do {
                                (&local_518)[lVar30] = local_568[lVar28 + lVar30];
                                lVar30 = lVar30 + 1;
                              } while (lVar30 != 3);
                            }
                            else {
                              RVar2 = local_568[lVar28];
                              local_518._0_4_ = SUB84(RVar2,0);
                              local_518._4_2_ = (undefined2)((ulong)RVar2 >> 0x20);
                              local_518._6_2_ = (undefined2)((ulong)RVar2 >> 0x30);
                              RVar2 = local_568[lVar28 + 2];
                              local_510 = SUB82(RVar2,0);
                              uStack_50e = (undefined4)((ulong)RVar2 >> 0x10);
                              uStack_50a = (undefined2)((ulong)RVar2 >> 0x30);
                              local_508 = 0.0;
                            }
                            dVar32 = (double)CONCAT26(local_518._6_2_,
                                                      CONCAT24(local_518._4_2_,(uint)local_518));
                            dVar33 = (double)CONCAT26(uStack_50a,CONCAT42(uStack_50e,local_510));
                            dVar32 = local_508 * local_508 + dVar33 * dVar33 + dVar32 * dVar32;
                            if (dVar32 < 0.0) {
                              dVar32 = sqrt(dVar32);
                            }
                            else {
                              dVar32 = SQRT(dVar32);
                            }
                            uVar11 = ref_search_touching((REF_SEARCH)CONCAT44(uStack_534,local_538),
                                                         (REF_LIST)
                                                         CONCAT44(local_570._4_4_,(uint)local_570),
                                                         (REF_DBL *)&local_518,dVar32 * 1e-06);
                            if (uVar11 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                     ,0xa4e,"ref_part_scalar_plt",(ulong)uVar11,"search tree");
                              goto LAB_001995d7;
                            }
                            pRVar27 = (REF_LIST)CONCAT44(local_570._4_4_,(uint)local_570);
                            iVar22 = -1;
                            if (0 < pRVar27->n) {
                              lVar28 = 0;
                              dVar32 = 1e+200;
                              do {
                                iVar3 = pRVar27->value[lVar28];
                                lVar30 = (long)iVar3;
                                pRVar15 = ref_node->real;
                                dVar33 = pRVar15[lVar30 * 0xf] -
                                         (double)CONCAT26(local_518._6_2_,
                                                          CONCAT24(local_518._4_2_,(uint)local_518))
                                ;
                                dVar34 = pRVar15[lVar30 * 0xf + 1] -
                                         (double)CONCAT26(uStack_50a,CONCAT42(uStack_50e,local_510))
                                ;
                                dVar33 = (pRVar15[lVar30 * 0xf + 2] - local_508) *
                                         (pRVar15[lVar30 * 0xf + 2] - local_508) +
                                         dVar34 * dVar34 + dVar33 * dVar33;
                                if (dVar33 < 0.0) {
                                  dVar33 = sqrt(dVar33);
                                }
                                else {
                                  dVar33 = SQRT(dVar33);
                                }
                                if (dVar32 <= dVar33) {
                                  dVar33 = dVar32;
                                  iVar3 = iVar22;
                                }
                                iVar22 = iVar3;
                                lVar28 = lVar28 + 1;
                                pRVar27 = (REF_LIST)CONCAT44(local_570._4_4_,(uint)local_570);
                                dVar32 = dVar33;
                              } while (lVar28 < pRVar27->n);
                            }
                            if ((iVar22 != -1) && (3 < (long)(int)local_548)) {
                              uVar11 = *local_560;
                              pRVar15 = *local_590;
                              lVar28 = 0;
                              do {
                                pRVar15[(long)iVar22 * (long)(int)uVar11 + lVar28] =
                                     local_568[(ulong)(local_548 * iVar9) + lVar28 + 3];
                                lVar28 = lVar28 + 1;
                              } while ((long)(int)local_548 + -3 != lVar28);
                            }
                            uVar11 = ref_list_erase(pRVar27);
                            if (uVar11 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                     ,0xa61,"ref_part_scalar_plt",(ulong)uVar11,"erase");
                              goto LAB_001995d7;
                            }
                            iVar9 = iVar9 + 1;
                          } while (iVar9 < local_540[0]);
                        }
                        iVar9 = (int)local_588;
                        if (local_568 != (REF_DBL *)0x0) {
                          free(local_568);
                        }
                        iVar9 = iVar9 + 1;
                      } while (iVar9 < local_530);
                    }
                    uVar11 = ref_list_free((REF_LIST)CONCAT44(local_570._4_4_,(uint)local_570));
                    if (uVar11 == 0) {
                      if (pRVar4->id == 0) {
                        fclose(local_5a8);
                        ref_list_free(local_578);
                        ref_list_free(local_5a0);
                        ref_list_free(local_598);
                        ref_list_free(local_5b0);
                      }
                      uVar10 = ref_search_free((REF_SEARCH)CONCAT44(uStack_534,local_538));
                      if (uVar10 != 0) {
                        pcVar25 = "free search";
                        uVar21 = 0xa6f;
                        goto LAB_00197c2e;
                      }
                      uVar11 = 0;
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                             ,0xa65,"ref_part_scalar_plt",(ulong)uVar11,"free touching");
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0xa22,"ref_part_scalar_plt",(ulong)uVar11,"touching list");
                  }
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0xa1d,"ref_part_scalar_plt",(ulong)uVar11,"b nzone");
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0xa1c,"ref_part_scalar_plt",(ulong)uVar11,"b nvar");
            }
          }
        }
        else {
          pcVar25 = "create search";
          uVar21 = 0x9fc;
LAB_00197c2e:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 uVar21,"ref_part_scalar_plt",(ulong)uVar10,pcVar25);
          uVar11 = uVar10;
        }
LAB_001995d7:
        local_5c0 = (char *)(ulong)uVar11;
        if (uVar11 == 0) {
          return 0;
        }
        pcVar25 = "snap failed";
        uVar21 = 0xcca;
      }
      else {
        local_5c0 = filename + (sVar14 - 5);
        iVar9 = strcmp(local_5c0,".solb");
        if (iVar9 == 0) {
          pRVar4 = ref_node->ref_mpi;
          local_5b0 = (REF_LIST)0xffffffffffffffff;
          if (pRVar4->id == 0) {
            uVar10 = ref_import_meshb_header(filename,(REF_INT *)&local_570,&local_518);
            local_5c0 = (char *)(ulong)uVar10;
            if (uVar10 == 0) {
              if (2 < (uint)local_570 - 2) {
                pcVar25 = "unsupported version";
                uVar21 = 0xba8;
                goto LAB_0019962c;
              }
              local_5b8 = fopen(filename,"r");
              if (local_5b8 == (FILE *)0x0) {
                printf("unable to open %s\n",filename);
                pcVar25 = "unable to open file";
                uVar21 = 0xbab;
LAB_001998e3:
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,uVar21,"ref_part_scalar_solb",pcVar25);
                local_5c0 = (char *)0x2;
              }
              else {
                uVar10 = ref_import_meshb_jump
                                   ((FILE *)local_5b8,(uint)local_570,&local_518,3,
                                    (REF_BOOL *)&local_578,(REF_FILEPOS *)&local_5b0);
                if (uVar10 == 0) {
                  if ((int)local_578 == 0) {
                    pcVar25 = "solb missing dimension";
                    uVar21 = 0xbaf;
LAB_0019962c:
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,uVar21,"ref_part_scalar_solb",pcVar25);
LAB_00199633:
                    local_5c0 = (char *)0x1;
                  }
                  else {
                    sVar14 = fread(&local_568,4,1,local_5b8);
                    if (sVar14 == 1) {
                      if (((uint)local_568 & 0xfffffffe) != 2) {
                        pcVar25 = "unsupported dimension";
                        uVar21 = 0xbb1;
                        goto LAB_0019962c;
                      }
                      uVar10 = ref_import_meshb_jump
                                         ((FILE *)local_5b8,(uint)local_570,&local_518,0x3e,
                                          (REF_BOOL *)&local_578,(REF_FILEPOS *)&local_5b0);
                      if (uVar10 == 0) {
                        if ((int)local_578 == 0) {
                          pcVar25 = "SolAtVertices missing";
                          uVar21 = 0xbb6;
                          local_590 = scalar;
                          goto LAB_0019962c;
                        }
                        local_590 = scalar;
                        uVar10 = ref_part_meshb_long((FILE *)local_5b8,(uint)local_570,
                                                     (REF_LONG *)&local_598);
                        if (uVar10 == 0) {
                          sVar14 = fread(&local_538,4,1,local_5b8);
                          if (sVar14 == 1) {
                            *ldim = 0;
                            if (0 < (int)local_538) {
                              uVar10 = local_538;
                              do {
                                sVar14 = fread(&local_548,4,1,local_5b8);
                                if (sVar14 != 1) {
                                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                         ,0xbbb,"ref_part_scalar_solb","type",1,sVar14);
                                  local_5c0 = (char *)0x1;
                                  goto LAB_001998f0;
                                }
                                if (1 < local_548 - 1) {
                                  printf("%s: %d: %s: %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                         ,0xbbe,"ref_part_scalar_solb",
                                         "only types 1 (scalar) or 2 (vector) supported");
                                  printf(" %d type\n",(ulong)local_548);
                                  goto LAB_00199633;
                                }
                                uVar11 = local_548;
                                if (local_548 == 1) {
LAB_0019938a:
                                  *ldim = *ldim + uVar11;
                                }
                                else if (local_548 == 2) {
                                  uVar11 = (uint)local_568;
                                  goto LAB_0019938a;
                                }
                                uVar10 = uVar10 - 1;
                              } while (uVar10 != 0);
                            }
                            local_5c0 = (char *)0x0;
                            scalar = local_590;
                            goto LAB_00197617;
                          }
                          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                 ,3000,"ref_part_scalar_solb","ntype",1,sVar14);
                          local_5c0 = (char *)0x1;
                        }
                        else {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                 ,2999,"ref_part_scalar_solb",(ulong)uVar10,"nnode");
                          local_5c0 = (char *)(ulong)uVar10;
                        }
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                               ,0xbb5,"ref_part_scalar_solb",(ulong)uVar10,"jmp");
                        local_5c0 = (char *)(ulong)uVar10;
                      }
                    }
                    else {
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                             ,0xbb0,"ref_part_scalar_solb","dim",1,sVar14);
                      local_5c0 = (char *)0x1;
                    }
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0xbae,"ref_part_scalar_solb",(ulong)uVar10,"jump");
                  local_5c0 = (char *)(ulong)uVar10;
                }
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0xba7,"ref_part_scalar_solb",local_5c0,"head");
            }
          }
          else {
            local_5b8 = (FILE *)0x0;
LAB_00197617:
            uVar10 = ref_mpi_bcast(ref_node->ref_mpi,&local_570,1,1);
            if (uVar10 == 0) {
              uVar10 = ref_mpi_bcast(ref_node->ref_mpi,&local_568,1,1);
              if (uVar10 == 0) {
                uVar10 = ref_mpi_bcast(ref_node->ref_mpi,&local_598,1,2);
                if (uVar10 == 0) {
                  uVar10 = ref_mpi_bcast(ref_node->ref_mpi,ldim,1,1);
                  if (uVar10 == 0) {
                    pRVar27 = (REF_LIST)ref_node->old_n_global;
                    if ((local_598 != pRVar27) && ((REF_LIST)((long)local_598 / 2) != pRVar27)) {
                      if (pRVar4->id == 0) {
                        printf("file %ld ref_node %ld %s\n",local_598,pRVar27,filename);
                      }
                      if ((long)local_598 <= ref_node->old_n_global) {
                        pcVar25 = "ERROR: global count mismatch, too few";
                        uVar21 = 0xbd5;
                        goto LAB_0019962c;
                      }
                      if (pRVar4->id == 0) {
                        printf("%s: %d: %s: %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                               ,0xbd3,"ref_part_scalar_solb");
                      }
                    }
                    iVar9 = *ldim;
                    uVar10 = ref_node->max * iVar9;
                    if ((int)uVar10 < 0) {
                      pcVar25 = "malloc *scalar of REF_DBL negative";
                      uVar21 = 0xbd9;
                      goto LAB_0019962c;
                    }
                    pRVar15 = (REF_DBL *)malloc((ulong)uVar10 << 3);
                    *scalar = pRVar15;
                    if (pRVar15 == (REF_DBL *)0x0) {
                      pcVar25 = "malloc *scalar of REF_DBL NULL";
                      uVar21 = 0xbd9;
                      goto LAB_001998e3;
                    }
                    lVar28 = (long)local_598 / (long)ref_node->ref_mpi->n;
                    local_550 = (REF_LIST)(long)(int)lVar28;
                    if (lVar28 < 100000) {
                      local_550 = (REF_LIST)0x186a0;
                    }
                    if ((long)local_598 <= (long)local_550) {
                      local_550 = local_598;
                    }
                    uVar10 = iVar9 * (int)local_550;
                    if ((int)uVar10 < 0) {
                      local_5c0 = (char *)0x1;
LAB_0019b25b:
                      bVar31 = false;
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                             ,0xbdf,"ref_part_scalar_solb");
                      pFVar16 = (FILE *)0x0;
                    }
                    else {
                      pFVar16 = (FILE *)malloc((ulong)uVar10 * 8);
                      if (pFVar16 == (FILE *)0x0) {
                        local_5c0 = (char *)0x2;
                        goto LAB_0019b25b;
                      }
                      bVar31 = true;
                      if (uVar10 != 0) {
                        uVar20 = 0;
                        do {
                          *(undefined8 *)(&pFVar16->_flags + uVar20 * 2) = 0xbff0000000000000;
                          uVar20 = uVar20 + 1;
                        } while (uVar10 != uVar20);
                      }
                      local_5c0 = (char *)((ulong)local_5c0 & 0xffffffff);
                    }
                    uVar10 = (uint)local_5c0;
                    if (bVar31) {
                      local_590 = scalar;
                      if (0 < (long)local_598) {
                        lVar28 = 0;
                        local_5a8 = pFVar16;
                        do {
                          uVar10 = (int)local_598 - (int)lVar28;
                          iVar9 = (int)local_550;
                          pcVar25 = (char *)(ulong)uVar10;
                          if (iVar9 < (int)uVar10) {
                            pcVar25 = (char *)((ulong)local_550 & 0xffffffff);
                          }
                          local_588 = pcVar25;
                          if (ref_node->ref_mpi->id == 0) {
                            sVar29 = (size_t)(*ldim * (int)pcVar25);
                            sVar14 = fread(local_5a8,8,sVar29,local_5b8);
                            if (sVar14 != sVar29) {
                              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                     ,0xbe7,"ref_part_scalar_solb","dat",sVar29,sVar14);
                              local_5c0 = (char *)0x1;
                            }
                            uVar10 = (uint)local_5c0;
                            if (sVar14 != sVar29) goto LAB_0019b7c1;
                            uVar10 = ref_mpi_bcast(ref_node->ref_mpi,local_5a8,*ldim * iVar9,3);
                            pcVar25 = local_588;
                            if (uVar10 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                     ,0xbea,"ref_part_scalar_solb",(ulong)uVar10,"bcast");
                              local_5c0 = (char *)(ulong)uVar10;
                              goto LAB_001998f0;
                            }
                          }
                          else {
                            uVar10 = ref_mpi_bcast(ref_node->ref_mpi,local_5a8,*ldim * iVar9,3);
                            if (uVar10 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                     ,0xbee,"ref_part_scalar_solb",(ulong)uVar10,"bcast");
                              local_5c0 = (char *)(ulong)uVar10;
                              goto LAB_001998f0;
                            }
                          }
                          uVar10 = (uint)local_5c0;
                          if (0 < (int)pcVar25) {
                            uVar20 = 0;
                            do {
                              uVar10 = ref_node_local(ref_node,uVar20 + lVar28,(REF_INT *)&local_5a0
                                                     );
                              if ((uVar10 != 0) && (uVar10 != 5)) {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                       ,0xbf2,"ref_part_scalar_solb",(ulong)uVar10,"local");
                                local_5c0 = (char *)(ulong)uVar10;
                              }
                              if ((uVar10 != 5) && (uVar10 != 0)) goto LAB_001998f0;
                              if ((uint)local_5a0 != -1) {
                                iVar9 = *ldim;
                                if (0 < (long)iVar9) {
                                  pRVar15 = *local_590;
                                  lVar30 = 0;
                                  do {
                                    pRVar15[(int)((uint)local_5a0 * iVar9) + lVar30] =
                                         *(REF_DBL *)
                                          (&local_5a8->_flags +
                                          (long)(iVar9 * (int)uVar20) * 2 + lVar30 * 2);
                                    lVar30 = lVar30 + 1;
                                  } while (iVar9 != lVar30);
                                }
                              }
                              if ((uint)local_568 == 2) {
                                uVar10 = ref_node_local(ref_node,(long)&local_598->n +
                                                                 uVar20 + lVar28,
                                                        (REF_INT *)&local_5a0);
                                if ((uVar10 != 0) && (uVar10 != 5)) {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                         ,0xbfa,"ref_part_scalar_solb",(ulong)uVar10,"local");
                                  local_5c0 = (char *)(ulong)uVar10;
                                }
                                if ((uVar10 != 5) && (uVar10 != 0)) goto LAB_001998f0;
                                if ((uint)local_5a0 != -1) {
                                  iVar9 = *ldim;
                                  if (0 < (long)iVar9) {
                                    pRVar15 = *local_590;
                                    lVar30 = 0;
                                    do {
                                      pRVar15[(int)((uint)local_5a0 * iVar9) + lVar30] =
                                           *(REF_DBL *)
                                            (&local_5a8->_flags +
                                            (long)((int)uVar20 * iVar9) * 2 + lVar30 * 2);
                                      lVar30 = lVar30 + 1;
                                    } while (iVar9 != lVar30);
                                  }
                                }
                              }
                              uVar10 = (uint)local_5c0;
                              uVar20 = uVar20 + 1;
                            } while (uVar20 != ((ulong)pcVar25 & 0xffffffff));
                          }
                          lVar28 = lVar28 + (int)local_588;
                          local_5c0 = (char *)(ulong)uVar10;
                          pFVar16 = local_5a8;
                        } while (lVar28 < (long)local_598);
                      }
                      if (pFVar16 != (FILE *)0x0) {
                        free(pFVar16);
                      }
                      pRVar27 = local_5b0;
                      if (ref_node->ref_mpi->id == 0) {
                        pRVar18 = (REF_LIST)ftello(local_5b8);
                        if (pRVar27 == pRVar18) {
                          iVar9 = fclose(local_5b8);
                          if (iVar9 != 0) {
                            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                   ,0xc09,"ref_part_scalar_solb","close file",0,(long)iVar9);
                            uVar10 = 1;
                          }
                          local_5c0 = (char *)(ulong)uVar10;
                          if (iVar9 == 0) goto LAB_0019b5da;
                        }
                        else {
                          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                 ,0xc08,"ref_part_scalar_solb","end location",pRVar27,pRVar18);
                          uVar10 = 1;
LAB_0019b7c1:
                          local_5c0 = (char *)(ulong)uVar10;
                        }
                      }
                      else {
LAB_0019b5da:
                        local_5c0 = (char *)0x0;
                      }
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0xbca,"ref_part_scalar_solb",(ulong)uVar10,"bcast ldim");
                    local_5c0 = (char *)(ulong)uVar10;
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0xbc8,"ref_part_scalar_solb",(ulong)uVar10,"bcast nnode");
                  local_5c0 = (char *)(ulong)uVar10;
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0xbc6,"ref_part_scalar_solb",(ulong)uVar10,"bcast dim");
                local_5c0 = (char *)(ulong)uVar10;
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0xbc4,"ref_part_scalar_solb",(ulong)uVar10,"bcast version");
              local_5c0 = (char *)(ulong)uVar10;
            }
          }
LAB_001998f0:
          if ((int)local_5c0 == 0) {
            return 0;
          }
          pcVar25 = "solb failed";
          uVar21 = 0xcc2;
        }
        else {
          iVar9 = strcmp(local_5c0,".snap");
          if (iVar9 != 0) goto LAB_0019751f;
          local_518._0_4_ = 0xffffffff;
          local_518._4_2_ = 0xffff;
          local_518._6_2_ = 0xffff;
          if (ref_node->ref_mpi->id == 0) {
            local_590 = scalar;
            pFVar16 = fopen(filename,"r");
            if (pFVar16 == (FILE *)0x0) {
              printf("unable to open %s\n",filename);
              pcVar25 = "unable to open file";
              uVar21 = 0xc2a;
LAB_00199499:
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,uVar21,"ref_part_scalar_snap",pcVar25);
              uVar11 = 2;
            }
            else {
              sVar14 = strlen(filename);
              iVar9 = strcmp(filename + (sVar14 - 5),".snap");
              if (iVar9 == 0) {
                sVar14 = fread(&local_5b0,8,1,pFVar16);
                if (sVar14 == 1) {
                  if (((ulong)local_5b0 & 0xfffffffffffffffe) != 2) {
                    pcVar25 = "only versions 2 and 3 supported";
                    uVar21 = 0xc35;
                    goto LAB_00199c38;
                  }
                  local_524 = (int)local_5b0;
                  sVar14 = fread(&local_598,8,1,pFVar16);
                  if (sVar14 == 1) {
                    *ldim = (REF_INT)local_598;
                    goto LAB_00197c61;
                  }
                  pcVar25 = "number";
                  uVar26 = 1;
                  uVar21 = 0xc39;
                }
                else {
                  pcVar25 = "version number";
                  uVar26 = 1;
                  uVar21 = 0xc33;
                }
              }
              else {
                sVar14 = (size_t)iVar9;
                pcVar25 = "snap extension expected";
                uVar21 = 0xc2e;
                uVar26 = 0;
              }
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,uVar21,"ref_part_scalar_snap",pcVar25,uVar26,sVar14);
LAB_00199c3f:
              uVar11 = 1;
            }
          }
          else {
            pFVar16 = (FILE *)0x0;
            local_590 = scalar;
LAB_00197c61:
            uVar10 = 1;
            uVar11 = ref_mpi_bcast(ref_node->ref_mpi,&local_524,1,1);
            if (uVar11 == 0) {
              uVar11 = ref_mpi_bcast(ref_node->ref_mpi,ldim,1,1);
              if (uVar11 == 0) {
                iVar9 = *ldim;
                uVar11 = ref_node->max * iVar9;
                if ((int)uVar11 < 0) {
                  pcVar25 = "malloc *scalar of REF_DBL negative";
                  uVar21 = 0xc40;
LAB_00199c38:
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,uVar21,"ref_part_scalar_snap",pcVar25);
                  goto LAB_00199c3f;
                }
                pRVar15 = (REF_DBL *)malloc((ulong)uVar11 << 3);
                *local_590 = pRVar15;
                if (pRVar15 == (REF_DBL *)0x0) {
                  pcVar25 = "malloc *scalar of REF_DBL NULL";
                  uVar21 = 0xc40;
                  goto LAB_00199499;
                }
                local_5a8 = pFVar16;
                if (0 < iVar9) {
                  local_558 = 0xffffffffffffffff;
                  iVar9 = 0;
                  local_560 = (uint *)ldim;
                  do {
                    pFVar16 = local_5a8;
                    if (ref_node->ref_mpi->id == 0) {
                      uVar11 = uVar10;
                      if (local_524 == 2) {
                        sVar14 = fread(&local_5a0,8,1,local_5a8);
                        if (sVar14 != 1) {
                          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                 ,0xc46,"ref_part_scalar_snap","number",1,sVar14);
                          uVar11 = 1;
                          goto LAB_00199c45;
                        }
                        iVar22 = (uint)local_5a0;
                        if (0 < (int)(uint)local_5a0) {
                          do {
                            sVar14 = fread(&local_579,1,1,pFVar16);
                            if (sVar14 != 1) {
                              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                     ,0xc48,"ref_part_scalar_snap","number",1,sVar14);
                              uVar11 = 1;
                              goto LAB_00199c45;
                            }
                            iVar22 = iVar22 + -1;
                          } while (iVar22 != 0);
                        }
                        sVar14 = fread(&local_578,8,1,pFVar16);
                        pRVar27 = local_578;
                        if (sVar14 != 1) {
                          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                 ,0xc4a,"ref_part_scalar_snap","number",1,sVar14);
                          uVar11 = 1;
                          goto LAB_00199c45;
                        }
                        local_558 = ftello(pFVar16);
                        sVar14 = fread(&local_570,8,1,pFVar16);
                        if (sVar14 != 1) {
                          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                 ,0xc4c,"ref_part_scalar_snap","number",1,sVar14);
                          uVar11 = 1;
                          goto LAB_00199c45;
                        }
                        local_518._0_4_ = (uint)local_570;
                        local_518._4_2_ = (undefined2)local_570._4_4_;
                        local_518._6_2_ = (undefined2)((uint)local_570._4_4_ >> 0x10);
                        sVar14 = fread(&local_520,4,1,pFVar16);
                        iVar22 = local_520;
                        if (sVar14 != 1) {
                          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                 ,0xc4e,"ref_part_scalar_snap","number",1,sVar14);
                          uVar11 = 1;
                          goto LAB_00199c45;
                        }
                        if ((long)local_520 != -1) {
                          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                 ,0xc4f,"ref_part_scalar_snap","field node association only",
                                 0xffffffffffffffff,(long)local_520);
                          uVar11 = 1;
                        }
                        if (iVar22 != -1) goto LAB_00199c45;
                        local_558 = (long)&pRVar27->n + local_558;
                        uVar10 = uVar11;
                      }
                      else {
                        sVar14 = fread(&local_568,8,1,local_5a8);
                        pRVar15 = local_568;
                        if (sVar14 == 1) {
                          local_558 = ftello(pFVar16);
                          sVar14 = fread(&local_538,8,1,pFVar16);
                          if (sVar14 != 1) {
                            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                   ,0xc59,"ref_part_scalar_snap","n_global",1,sVar14);
                            uVar11 = 1;
                          }
                          local_558 = local_558 + (long)pRVar15;
                          if (sVar14 != 1) goto LAB_0019880f;
                          local_588 = filename;
                          sVar14 = fread(&local_548,8,1,local_5a8);
                          if (sVar14 == 1) {
                            local_518._0_4_ = local_538;
                            local_518._4_2_ = (undefined2)uStack_534;
                            local_518._6_2_ = (undefined2)((uint)uStack_534 >> 0x10);
                            if (CONCAT44(uStack_544,local_548) != 1) {
                              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                     ,0xc5e,"ref_part_scalar_snap","require entry_length == 1",1,
                                     CONCAT44(uStack_544,local_548));
                              goto LAB_00198825;
                            }
                            sVar14 = fread(&local_530,8,1,local_5a8);
                            if (sVar14 != 1) {
                              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                     ,0xc60,"ref_part_scalar_snap","count",1,sVar14);
                              goto LAB_00198825;
                            }
                            lVar28 = CONCAT44(uStack_52c,local_530);
                            if (lVar28 == 0) {
                              bVar31 = true;
                              filename = local_588;
                            }
                            else {
                              lVar30 = 0;
                              do {
                                sVar14 = fread(local_540,8,1,local_5a8);
                                if (sVar14 == 1) {
                                  iVar22 = local_540[0];
                                  if (0 < local_540[0]) {
                                    do {
                                      sVar14 = fread(&local_579,1,1,local_5a8);
                                      if (sVar14 != 1) {
                                        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                               ,0xc66,"ref_part_scalar_snap","number",1,sVar14);
                                        goto LAB_001987f5;
                                      }
                                      iVar22 = iVar22 + -1;
                                    } while (iVar22 != 0);
                                  }
                                  sVar14 = fread(local_540,8,1,local_5a8);
                                  if (sVar14 != 1) {
                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                           ,0xc69,"ref_part_scalar_snap","length",1,sVar14);
                                    goto LAB_001987f5;
                                  }
                                  iVar22 = local_540[0];
                                  if (local_540[0] < 1) {
                                    bVar31 = true;
                                  }
                                  else {
                                    do {
                                      iVar22 = iVar22 + -1;
                                      sVar14 = fread(&local_579,1,1,local_5a8);
                                      bVar31 = sVar14 == 1;
                                      if (!bVar31) {
                                        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                               ,0xc6b,"ref_part_scalar_snap","number",1,sVar14);
                                        uVar11 = 1;
                                      }
                                    } while ((sVar14 == 1) && (iVar22 != 0));
                                  }
                                }
                                else {
                                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                         ,0xc64,"ref_part_scalar_snap","length",1,sVar14);
LAB_001987f5:
                                  uVar11 = 1;
                                  bVar31 = false;
                                }
                                filename = local_588;
                              } while ((bVar31) && (lVar30 = lVar30 + 1, lVar30 != lVar28));
                            }
                          }
                          else {
                            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                   ,0xc5c,"ref_part_scalar_snap","entry_length_uint64",1,sVar14);
LAB_00198825:
                            uVar11 = 1;
                            bVar31 = false;
                            filename = local_588;
                          }
                        }
                        else {
                          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                 ,0xc57,"ref_part_scalar_snap","length_remaining",1,sVar14);
                          uVar11 = 1;
LAB_0019880f:
                          bVar31 = false;
                        }
                        uVar10 = uVar11;
                        if (!bVar31) goto LAB_00199c45;
                      }
                      lVar28 = CONCAT26(local_518._6_2_,CONCAT24(local_518._4_2_,(uint)local_518));
                      if ((lVar28 != ref_node->old_n_global) &&
                         (lVar28 / 2 != ref_node->old_n_global)) {
                        printf("file %ld ref_node %ld\n");
                        pcVar25 = "global count mismatch";
                        uVar21 = 0xc78;
                        goto LAB_00199c38;
                      }
                    }
                    uVar11 = ref_mpi_bcast(ref_node->ref_mpi,&local_518,1,1);
                    pFVar16 = local_5a8;
                    if (uVar11 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                             ,0xc7c,"ref_part_scalar_snap",(ulong)uVar11,"bcast ldim");
                      goto LAB_00199c45;
                    }
                    pcVar25 = (char *)CONCAT26(local_518._6_2_,
                                               CONCAT24(local_518._4_2_,(uint)local_518));
                    lVar28 = (long)pcVar25 / (long)ref_node->ref_mpi->n;
                    local_588 = (char *)(long)(int)lVar28;
                    if (lVar28 < 100000) {
                      local_588 = (char *)0x186a0;
                    }
                    if ((long)pcVar25 <= (long)local_588) {
                      local_588 = pcVar25;
                    }
                    uVar13 = (uint)local_588;
                    if ((int)uVar13 < 0) {
                      uVar11 = 1;
                      pcVar25 = "malloc data of REF_DBL negative";
LAB_0019812f:
                      bVar31 = false;
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                             ,0xc81,"ref_part_scalar_snap",pcVar25);
                    }
                    else {
                      filename = (char *)malloc((ulong)(uVar13 & 0x7fffffff) << 3);
                      if (filename == (char *)0x0) {
                        uVar11 = 2;
                        pcVar25 = "malloc data of REF_DBL NULL";
                        filename = (char *)0x0;
                        goto LAB_0019812f;
                      }
                      bVar31 = true;
                      uVar11 = uVar10;
                      if (uVar13 != 0) {
                        uVar20 = 0;
                        do {
                          pcVar25 = filename + uVar20 * 8;
                          pcVar25[0] = '\0';
                          pcVar25[1] = '\0';
                          pcVar25[2] = '\0';
                          pcVar25[3] = '\0';
                          pcVar25[4] = '\0';
                          pcVar25[5] = '\0';
                          pcVar25[6] = -0x10;
                          pcVar25[7] = -0x41;
                          uVar20 = uVar20 + 1;
                        } while ((uVar13 & 0x7fffffff) != uVar20);
                      }
                    }
                    if (!bVar31) goto LAB_00199c45;
                    lVar28 = CONCAT26(local_518._6_2_,CONCAT24(local_518._4_2_,(uint)local_518));
                    if (0 < lVar28) {
                      local_550 = (REF_LIST)(long)(int)local_588;
                      lVar30 = 0;
                      do {
                        pRVar27 = (REF_LIST)(lVar28 - lVar30);
                        if ((long)local_550 < lVar28 - lVar30) {
                          pRVar27 = local_550;
                        }
                        uVar10 = (uint)pRVar27;
                        if (ref_node->ref_mpi->id == 0) {
                          sVar29 = (size_t)(int)uVar10;
                          sVar14 = fread(filename,8,sVar29,pFVar16);
                          if (sVar29 != sVar14) {
                            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                   ,0xc8c,"ref_part_scalar_snap","dat",sVar29,sVar14);
                            uVar11 = 1;
                            goto LAB_00199c45;
                          }
                          uVar13 = ref_mpi_bcast(ref_node->ref_mpi,filename,(REF_INT)local_588,3);
                          if (uVar13 != 0) {
                            uVar21 = 0xc8e;
                            uVar11 = uVar13;
                            goto LAB_00198266;
                          }
                        }
                        else {
                          uVar13 = ref_mpi_bcast(ref_node->ref_mpi,filename,(REF_INT)local_588,3);
                          if (uVar13 != 0) {
                            uVar21 = 0xc91;
                            uVar11 = uVar13;
LAB_00198266:
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                   ,uVar21,"ref_part_scalar_snap",(ulong)uVar11,"bcast");
                            uVar13 = uVar11;
                          }
                        }
                        if (uVar13 != 0) goto LAB_00199c45;
                        if (0 < (int)uVar10) {
                          uVar20 = 0;
                          do {
                            uVar13 = ref_node_local(ref_node,lVar30 + uVar20,&local_51c);
                            if ((uVar13 != 0) && (uVar13 != 5)) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                     ,0xc95,"ref_part_scalar_snap",(ulong)uVar13,"local");
                              uVar11 = uVar13;
                            }
                            if ((uVar13 != 5) && (uVar13 != 0)) goto LAB_00199c45;
                            if (local_51c != -1) {
                              (*local_590)[(int)(local_51c * *local_560 + iVar9)] =
                                   *(REF_DBL *)(filename + uVar20 * 8);
                            }
                            uVar20 = uVar20 + 1;
                          } while ((uVar10 & 0x7fffffff) != uVar20);
                        }
                        lVar30 = lVar30 + (int)uVar10;
                        lVar28 = CONCAT26(local_518._6_2_,CONCAT24(local_518._4_2_,(uint)local_518))
                        ;
                        pFVar16 = local_5a8;
                      } while (lVar30 < lVar28);
                    }
                    if (filename != (char *)0x0) {
                      free(filename);
                    }
                    uVar10 = uVar11;
                    if ((ref_node->ref_mpi->id == 0) &&
                       (CONCAT26(local_518._6_2_,CONCAT24(local_518._4_2_,(uint)local_518)) ==
                        ref_node->old_n_global)) {
                      uVar20 = ftello(local_5a8);
                      if (local_558 != uVar20) {
                        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                               ,0xca1,"ref_part_scalar_snap","end location",local_558,uVar20);
                        uVar11 = 1;
                      }
                      uVar10 = uVar11;
                      if (local_558 != uVar20) goto LAB_00199c45;
                    }
                    iVar9 = iVar9 + 1;
                  } while (iVar9 < (int)*local_560);
                }
                if ((ref_node->ref_mpi->id == 0) && (iVar9 = fclose(local_5a8), iVar9 != 0)) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0xca6,"ref_part_scalar_snap","close file",0,(long)iVar9);
                  uVar11 = 1;
                }
                else {
                  uVar11 = 0;
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0xc3f,"ref_part_scalar_snap",(ulong)uVar11,"bcast ldim");
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0xc3d,"ref_part_scalar_snap",(ulong)uVar11,"bcast ldim");
            }
          }
LAB_00199c45:
          local_5c0 = (char *)(ulong)uVar11;
          if (uVar11 == 0) {
            return 0;
          }
          pcVar25 = "snap failed";
          uVar21 = 0xcc6;
        }
      }
    }
    else {
      local_5c0 = filename + (sVar14 - 4);
      iVar9 = strcmp(local_5c0,".rst");
      if (iVar9 == 0) {
        pRVar4 = ref_node->ref_mpi;
        if (pRVar4->id == 0) {
          local_590 = scalar;
          pFVar16 = fopen(filename,"r");
          if (pFVar16 == (FILE *)0x0) {
            bVar31 = false;
            printf("unable to open %s\n",filename);
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0xabc,"ref_part_scalar_rst","unable to open file");
            uVar10 = 2;
          }
          else {
            sVar14 = fread(&local_578,4,1,pFVar16);
            if (sVar14 == 1) {
              sVar14 = (size_t)(int)local_578;
              printf("%d length of magic string\n",(ulong)local_578 & 0xffffffff);
              if (sVar14 != 8) {
                pcVar25 = "magic string length";
                uVar26 = 8;
                uVar21 = 0xabf;
                goto LAB_00199e66;
              }
              iVar9 = 8;
              do {
                sVar14 = fread(&local_538,1,1,pFVar16);
                if (sVar14 != 1) {
                  pcVar25 = "dim";
                  uVar26 = 1;
                  uVar21 = 0xac1;
                  goto LAB_00199e66;
                }
                putchar((int)(char)local_538);
                iVar9 = iVar9 + -1;
              } while (iVar9 != 0);
              putchar(10);
              sVar14 = fread(&local_570,4,1,pFVar16);
              if (sVar14 != 1) {
                pcVar25 = "dim";
                uVar26 = 1;
                uVar21 = 0xac5;
                goto LAB_00199e66;
              }
              sVar14 = (size_t)(int)(uint)local_570;
              printf("%d version\n",(ulong)(uint)local_570);
              if (sVar14 != 2) {
                pcVar25 = "version";
                uVar26 = 2;
                uVar21 = 0xac7;
                goto LAB_00199e66;
              }
              sVar14 = fread(&local_518,4,1,pFVar16);
              if (sVar14 != 1) {
                pcVar25 = "dim";
                uVar26 = 1;
                uVar21 = 0xac8;
                goto LAB_00199e66;
              }
              printf("%d dim\n",(ulong)(uint)local_518);
              if (((uint)local_518 & 0xfffffffe) == 2) {
                sVar14 = fread(&local_5b0,4,1,pFVar16);
                if (sVar14 == 1) {
                  printf("%d variables\n",(ulong)local_5b0 & 0xffffffff);
                  sVar14 = fread(&local_598,4,1,pFVar16);
                  if (sVar14 == 1) {
                    printf("%d steps\n",(ulong)local_598 & 0xffffffff);
                    sVar14 = fread(&local_5a0,4,1,pFVar16);
                    if (sVar14 == 1) {
                      printf("%d dof\n",(ulong)local_5a0 & 0xffffffff);
                      sVar14 = fread(&local_568,4,1,pFVar16);
                      if (sVar14 == 1) {
                        lVar28 = (long)(int)(uint)local_568;
                        printf("%d doubles\n",(ulong)local_568 & 0xffffffff);
                        uVar10 = 1;
                        bVar31 = lVar28 == 0;
                        if (!bVar31) {
                          bVar31 = false;
                          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                 ,0xad3,"ref_part_scalar_rst","expected zero doubles",0,lVar28);
                        }
                        goto LAB_00199e72;
                      }
                      pcVar25 = "doubles";
                      uVar26 = 1;
                      uVar21 = 0xad1;
                    }
                    else {
                      pcVar25 = "dof";
                      uVar26 = 1;
                      uVar21 = 0xacf;
                    }
                  }
                  else {
                    pcVar25 = "steps";
                    uVar26 = 1;
                    uVar21 = 0xacd;
                  }
                }
                else {
                  pcVar25 = "variables";
                  uVar26 = 1;
                  uVar21 = 0xacb;
                }
                goto LAB_00199e66;
              }
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0xaca,"ref_part_scalar_rst","dim");
            }
            else {
              pcVar25 = "dim";
              uVar26 = 1;
              uVar21 = 0xabd;
LAB_00199e66:
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,uVar21,"ref_part_scalar_rst",pcVar25,uVar26,sVar14);
            }
            bVar31 = false;
            uVar10 = 1;
          }
LAB_00199e72:
          local_5c0 = (char *)(ulong)uVar10;
          if (bVar31) goto LAB_00199e83;
        }
        else {
          pFVar16 = (FILE *)0x0;
          local_590 = scalar;
LAB_00199e83:
          uVar10 = ref_mpi_bcast(pRVar4,&local_518,1,1);
          if (uVar10 == 0) {
            uVar10 = ref_mpi_bcast(pRVar4,&local_5b0,1,1);
            if (uVar10 == 0) {
              uVar10 = ref_mpi_bcast(pRVar4,&local_598,1,1);
              if (uVar10 == 0) {
                uVar10 = ref_mpi_bcast(pRVar4,&local_5a0,1,1);
                if (uVar10 == 0) {
                  if (ref_node->old_n_global == (long)(int)(uint)local_5a0) {
LAB_0019a03b:
                    iVar9 = (int)local_5b0;
                    *ldim = (REF_INT)local_598 * (int)local_5b0;
                    uVar10 = (REF_INT)local_598 * (int)local_5b0 * ref_node->max;
                    if (-1 < (int)uVar10) {
                      pRVar15 = (REF_DBL *)malloc((ulong)uVar10 << 3);
                      *local_590 = pRVar15;
                      if (pRVar15 == (REF_DBL *)0x0) {
                        printf("%s: %d: %s: %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                               ,0xae6,"ref_part_scalar_rst","malloc *scalar of REF_DBL NULL");
                        local_5c0 = (char *)0x2;
                        goto LAB_0019b209;
                      }
                      uVar20 = (ulong)(int)(uint)local_5a0;
                      lVar28 = (long)uVar20 / (long)ref_node->ref_mpi->n;
                      local_558 = (ulong)(int)lVar28;
                      if (lVar28 < 100000) {
                        local_558 = 100000;
                      }
                      if ((long)uVar20 <= (long)local_558) {
                        local_558 = uVar20;
                      }
                      uVar10 = iVar9 * (int)local_558;
                      if ((int)uVar10 < 0) {
                        local_5c0 = (char *)0x1;
                        pcVar25 = "malloc data of REF_DBL negative";
LAB_0019aac8:
                        uVar20 = local_558;
                        bVar31 = false;
                        printf("%s: %d: %s: %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                               ,0xaec,"ref_part_scalar_rst",pcVar25);
                        pvVar17 = (void *)0x0;
                      }
                      else {
                        pvVar17 = malloc((ulong)uVar10 * 8);
                        if (pvVar17 == (void *)0x0) {
                          local_5c0 = (char *)0x2;
                          pcVar25 = "malloc data of REF_DBL NULL";
                          goto LAB_0019aac8;
                        }
                        bVar31 = true;
                        if (uVar10 != 0) {
                          uVar20 = 0;
                          do {
                            *(undefined8 *)((long)pvVar17 + uVar20 * 8) = 0xbff0000000000000;
                            uVar20 = uVar20 + 1;
                          } while (uVar10 != uVar20);
                        }
                        local_5c0 = (char *)((ulong)local_5c0 & 0xffffffff);
                        uVar20 = local_558;
                      }
                      if (bVar31) {
                        if (0 < (REF_INT)local_598) {
                          local_5a8 = (FILE *)((ulong)local_5a8 & 0xffffffff00000000);
                          local_560 = (uint *)ldim;
                          do {
                            uVar23 = (ulong)local_5a0 & 0xffffffff;
                            bVar19 = 0 < (int)(uint)local_5a0;
                            if (0 < (int)(uint)local_5a0) {
                              lVar28 = 0;
                              do {
                                local_550 = (REF_LIST)CONCAT71(local_550._1_7_,bVar19);
                                uVar10 = (int)uVar23 - (int)lVar28;
                                iVar9 = (int)uVar20;
                                pcVar25 = (char *)(ulong)uVar10;
                                if (iVar9 <= (int)uVar10) {
                                  pcVar25 = (char *)(uVar20 & 0xffffffff);
                                }
                                local_588 = pcVar25;
                                if (ref_node->ref_mpi->id == 0) {
                                  sVar29 = (size_t)((int)local_5b0 * (int)pcVar25);
                                  sVar14 = fread(pvVar17,8,sVar29,pFVar16);
                                  if (sVar14 == sVar29) {
                                    uVar10 = ref_mpi_bcast(ref_node->ref_mpi,pvVar17,
                                                           (int)local_5b0 * iVar9,3);
                                    pcVar25 = local_588;
                                    if (uVar10 == 0) goto LAB_0019b0a6;
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                           ,0xafa,"ref_part_scalar_rst",(ulong)uVar10,"bcast");
                                    local_5c0 = (char *)(ulong)uVar10;
                                  }
                                  else {
                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                           ,0xaf7,"ref_part_scalar_rst","dat",sVar29,sVar14);
                                    local_5c0 = (char *)0x1;
                                  }
LAB_0019b1b7:
                                  bVar19 = (byte)local_550;
                                  break;
                                }
                                uVar10 = ref_mpi_bcast(ref_node->ref_mpi,pvVar17,
                                                       (int)local_5b0 * iVar9,3);
                                if (uVar10 != 0) {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                         ,0xafe,"ref_part_scalar_rst",(ulong)uVar10,"bcast");
                                  local_5c0 = (char *)(ulong)uVar10;
                                  goto LAB_0019b1b7;
                                }
LAB_0019b0a6:
                                uVar10 = (uint)local_5c0;
                                if (0 < (int)pcVar25) {
                                  uVar23 = 0;
                                  do {
                                    uVar11 = ref_node_local(ref_node,uVar23 + lVar28,
                                                            (REF_INT *)&local_578);
                                    if ((uVar11 != 0) && (uVar11 != 5)) {
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                             ,0xb02,"ref_part_scalar_rst",(ulong)uVar11,"local");
                                      local_5c0 = (char *)(ulong)uVar11;
                                    }
                                    uVar10 = (uint)local_5c0;
                                    if ((uVar11 != 5) && (uVar20 = local_558, uVar11 != 0))
                                    goto LAB_0019b1b7;
                                    if ((long)(int)local_578 != -1) {
                                      if (0 < (long)(int)local_5b0) {
                                        uVar11 = *local_560;
                                        pRVar15 = *local_590;
                                        lVar30 = 0;
                                        do {
                                          pRVar15[(long)(int)uVar11 * (long)(int)local_578 +
                                                  (ulong)(uint)((int)local_5a8 * (int)local_5b0) +
                                                  lVar30] =
                                               *(REF_DBL *)
                                                ((long)pvVar17 +
                                                lVar30 * 8 +
                                                (long)((int)uVar23 * (int)local_5b0) * 8);
                                          lVar30 = lVar30 + 1;
                                        } while ((int)local_5b0 != lVar30);
                                      }
                                    }
                                    uVar23 = uVar23 + 1;
                                  } while (uVar23 != ((ulong)pcVar25 & 0xffffffff));
                                }
                                lVar28 = lVar28 + (int)local_588;
                                uVar23 = (ulong)(int)(uint)local_5a0;
                                bVar19 = lVar28 < (long)uVar23;
                                local_5c0 = (char *)(ulong)uVar10;
                                uVar20 = local_558;
                              } while (lVar28 < (long)uVar23);
                            }
                            if ((bVar19 & 1) != 0) goto LAB_0019b209;
                            iVar9 = (int)local_5a8 + 1;
                            local_5a8 = (FILE *)CONCAT44(local_5a8._4_4_,iVar9);
                          } while (iVar9 < (REF_INT)local_598);
                        }
                        if (pvVar17 != (void *)0x0) {
                          free(pvVar17);
                        }
                        local_5c0 = (char *)0x0;
                        if (pRVar4->id == 0) {
                          fclose(pFVar16);
                        }
                      }
                      goto LAB_0019b209;
                    }
                    pcVar25 = "malloc *scalar of REF_DBL negative";
                    uVar21 = 0xae6;
                  }
                  else {
                    if (pRVar4->id == 0) {
                      printf("file dof %d ref_node %ld %s\n",(long)(int)(uint)local_5a0,
                             ref_node->old_n_global,filename);
                    }
                    if (ref_node->old_n_global <= (long)(int)(uint)local_5a0) goto LAB_0019a03b;
                    pcVar25 = "ERROR: too small global dof";
                    uVar21 = 0xae1;
                  }
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,uVar21,"ref_part_scalar_rst",pcVar25);
                  local_5c0 = (char *)0x1;
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0xad9,"ref_part_scalar_rst",(ulong)uVar10,"bcast dim");
                  local_5c0 = (char *)(ulong)uVar10;
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0xad8,"ref_part_scalar_rst",(ulong)uVar10,"bcast dim");
                local_5c0 = (char *)(ulong)uVar10;
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0xad7,"ref_part_scalar_rst",(ulong)uVar10,"bcast dim");
              local_5c0 = (char *)(ulong)uVar10;
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0xad6,"ref_part_scalar_rst",(ulong)uVar10,"bcast dim");
            local_5c0 = (char *)(ulong)uVar10;
          }
        }
LAB_0019b209:
        if ((int)local_5c0 == 0) {
          return 0;
        }
        pcVar25 = "rst failed";
        uVar21 = 0xcba;
      }
      else {
        iVar9 = strcmp(local_5c0,".sol");
        if (iVar9 != 0) goto LAB_001974e3;
        pRVar4 = ref_node->ref_mpi;
        local_5b0 = (REF_LIST)0xffffffffffffffff;
        if (pRVar4->id == 0) {
          local_5b8 = fopen(filename,"r");
          if (local_5b8 == (FILE *)0x0) {
            printf("unable to open %s\n",filename);
            pcVar25 = "unable to open file";
            uVar21 = 0xb29;
LAB_00199410:
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   uVar21,"ref_part_scalar_sol",pcVar25);
            local_5c0 = (char *)0x2;
            goto LAB_0019a890;
          }
          local_5a0 = (REF_LIST)CONCAT44(local_5a0._4_4_,0xffffffff);
          local_590 = scalar;
          local_560 = (uint *)ldim;
          do {
            iVar9 = feof(local_5b8);
            bVar31 = true;
            if (iVar9 != 0) goto LAB_0019942b;
            iVar9 = __isoc99_fscanf(local_5b8,"%s",&local_518);
            if (iVar9 != 1) {
              if (iVar9 == -1) goto LAB_0019942b;
              lVar28 = (long)iVar9;
              pcVar25 = "line read failed";
              uVar21 = 0xb2f;
              goto LAB_0019a883;
            }
            if (local_510 == 0x6e &&
                CONCAT26(local_518._6_2_,CONCAT24(local_518._4_2_,(uint)local_518)) ==
                0x6f69736e656d6944) {
              iVar9 = __isoc99_fscanf(local_5b8,"%d",&local_5a0);
              if (iVar9 != 1) {
                lVar28 = (long)iVar9;
                pcVar25 = "read dim";
                uVar21 = 0xb32;
                goto LAB_0019a883;
              }
              printf("dim %d\n",(ulong)local_5a0 & 0xffffffff);
            }
          } while (CONCAT44(uStack_50e,CONCAT22(local_510,local_518._6_2_)) != 0x73656369747265 ||
                   CONCAT26(local_518._6_2_,CONCAT24(local_518._4_2_,(uint)local_518)) !=
                   0x72655674416c6f53);
          iVar9 = __isoc99_fscanf(local_5b8,"%ld",&local_5b0);
          if (iVar9 == 1) {
            printf("nnode %d\n",(ulong)local_5b0 & 0xffffffff);
            iVar9 = __isoc99_fscanf(local_5b8,"%d",&local_578);
            if (iVar9 != 1) {
              lVar28 = (long)iVar9;
              pcVar25 = "read ldim";
              uVar21 = 0xb39;
              goto LAB_0019a883;
            }
            printf("ntype %d\n",(ulong)local_578 & 0xffffffff);
            *local_560 = 0;
            if (0 < (int)local_578) {
              uVar10 = 0;
              do {
                iVar9 = __isoc99_fscanf(local_5b8,"%d",&local_570);
                if (iVar9 != 1) {
                  lVar28 = (long)iVar9;
                  pcVar25 = "read type";
                  uVar21 = 0xb3d;
                  goto LAB_0019a883;
                }
                printf("%d type %d\n",(ulong)uVar10,(ulong)(uint)local_570);
                uVar11 = (uint)local_570;
                if ((uint)local_570 != 1) {
                  if ((uint)local_570 != 2) {
                    printf("item %d type %d\n",(ulong)uVar10);
                    pcVar25 = "solb type";
                    uVar21 = 0xb45;
                    goto LAB_00199769;
                  }
                  uVar11 = (uint)local_5a0;
                }
                *local_560 = *local_560 + uVar11;
                uVar10 = uVar10 + 1;
              } while ((int)uVar10 < (int)local_578);
            }
            bVar31 = false;
            iVar9 = __isoc99_fscanf(local_5b8,"%*[^1234567890-+.]");
            if (iVar9 < 0) {
              pcVar25 = "skip blank line";
              uVar21 = 0xb48;
            }
            else {
LAB_0019942b:
              ldim = (REF_INT *)local_560;
              if ((uint)local_5a0 == -1) {
                pcVar25 = "Dimension keyword missing from .sol metric";
                uVar21 = 0xb4d;
              }
              else {
                if (!bVar31) {
                  printf("nnode %d ldim %d dim %d\n",(ulong)local_5b0 & 0xffffffff,(ulong)*local_560
                        );
                  scalar = local_590;
                  goto LAB_001978d8;
                }
                pcVar25 = "SolAtVertices keyword missing from .sol metric";
                uVar21 = 0xb4e;
              }
            }
LAB_00199769:
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   uVar21,"ref_part_scalar_sol",pcVar25);
          }
          else {
            lVar28 = (long)iVar9;
            pcVar25 = "read nnode";
            uVar21 = 0xb37;
LAB_0019a883:
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   uVar21,"ref_part_scalar_sol",pcVar25,1,lVar28);
          }
          local_5c0 = (char *)0x1;
        }
        else {
          local_5b8 = (FILE *)0x0;
LAB_001978d8:
          uVar10 = ref_mpi_bcast(pRVar4,&local_5b0,1,2);
          if (uVar10 == 0) {
            uVar10 = ref_mpi_bcast(pRVar4,ldim,1,1);
            if (uVar10 == 0) {
              uVar10 = ref_mpi_bcast(pRVar4,&local_5a0,1,1);
              if (uVar10 == 0) {
                pRVar27 = (REF_LIST)ref_node->old_n_global;
                if ((local_5b0 != pRVar27) && ((REF_LIST)((long)local_5b0 / 2) != pRVar27)) {
                  if (pRVar4->id == 0) {
                    printf("file %ld ref_node %ld %s\n",local_5b0,pRVar27,filename);
                  }
                  if ((long)local_5b0 <= ref_node->old_n_global) {
                    pcVar25 = "ERROR: global count mismatch, too few";
                    uVar21 = 0xb5e;
                    goto LAB_00199769;
                  }
                  if (pRVar4->id == 0) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0xb5c,"ref_part_scalar_sol");
                  }
                }
                uVar10 = *ldim;
                uVar11 = ref_node->max * uVar10;
                if ((int)uVar11 < 0) {
                  pcVar25 = "malloc *scalar of REF_DBL negative";
                  uVar21 = 0xb62;
                  goto LAB_00199769;
                }
                pRVar15 = (REF_DBL *)malloc((ulong)uVar11 << 3);
                *scalar = pRVar15;
                if (pRVar15 == (REF_DBL *)0x0) {
                  pcVar25 = "malloc *scalar of REF_DBL NULL";
                  uVar21 = 0xb62;
                  goto LAB_00199410;
                }
                lVar28 = (long)local_5b0 / (long)ref_node->ref_mpi->n;
                pRVar27 = (REF_LIST)(long)(int)lVar28;
                if (lVar28 < 100000) {
                  pRVar27 = (REF_LIST)0x186a0;
                }
                if ((long)local_5b0 <= (long)pRVar27) {
                  pRVar27 = local_5b0;
                }
                uVar10 = uVar10 * (int)pRVar27;
                if ((int)uVar10 < 0) {
                  local_5c0 = (char *)0x1;
LAB_0019aa83:
                  bVar31 = false;
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0xb68,"ref_part_scalar_sol");
                  pFVar16 = (FILE *)0x0;
                }
                else {
                  pFVar16 = (FILE *)malloc((ulong)uVar10 * 8);
                  if (pFVar16 == (FILE *)0x0) {
                    local_5c0 = (char *)0x2;
                    goto LAB_0019aa83;
                  }
                  bVar31 = true;
                  if (uVar10 != 0) {
                    uVar20 = 0;
                    do {
                      *(undefined8 *)(&pFVar16->_flags + uVar20 * 2) = 0xbff0000000000000;
                      uVar20 = uVar20 + 1;
                    } while (uVar10 != uVar20);
                  }
                  local_5c0 = (char *)0x1;
                }
                if (bVar31) {
                  if (0 < (long)local_5b0) {
                    lVar28 = 0;
                    local_5a8 = pFVar16;
                    local_590 = scalar;
                    local_550 = pRVar27;
                    do {
                      uVar10 = (uint)local_5c0;
                      uVar11 = (int)local_5b0 - (int)lVar28;
                      local_588 = (char *)(ulong)uVar11;
                      if ((int)local_550 < (int)uVar11) {
                        local_588 = (char *)((ulong)local_550 & 0xffffffff);
                      }
                      uVar11 = *ldim;
                      if (ref_node->ref_mpi->id == 0) {
                        if (0 < (int)(uVar11 * (int)local_588)) {
                          lVar30 = 0;
                          pFVar16 = local_5a8;
                          do {
                            iVar9 = __isoc99_fscanf(local_5b8,"%lf",pFVar16);
                            if (iVar9 != 1) {
                              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                     ,0xb6f,"ref_part_scalar_sol","vertex data read error",1,
                                     (long)iVar9);
                              local_5c0 = (char *)0x1;
                            }
                            uVar10 = (uint)local_5c0;
                            if (iVar9 != 1) goto LAB_0019aed7;
                            lVar30 = lVar30 + 1;
                            uVar11 = *ldim;
                            pFVar16 = (FILE *)&pFVar16->_IO_read_ptr;
                          } while (lVar30 < (int)(uVar11 * (int)local_588));
                        }
                        uVar11 = ref_mpi_bcast(ref_node->ref_mpi,local_5a8,uVar11 * (int)local_550,3
                                              );
                        if (uVar11 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                 ,0xb72,"ref_part_scalar_sol",(ulong)uVar11,"bcast");
                          uVar10 = uVar11;
                        }
                        local_5c0 = (char *)(ulong)uVar10;
                      }
                      else {
                        uVar11 = ref_mpi_bcast(ref_node->ref_mpi,local_5a8,uVar11 * (int)local_550,3
                                              );
                        if (uVar11 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                 ,0xb76,"ref_part_scalar_sol",(ulong)uVar11,"bcast");
                          local_5c0 = (char *)(ulong)uVar11;
                        }
                      }
                      if (uVar11 != 0) goto LAB_0019a890;
                      uVar10 = (uint)local_5c0;
                      if (0 < (int)local_588) {
                        uVar23 = (ulong)local_588 & 0xffffffff;
                        uVar20 = 0;
                        do {
                          uVar11 = ref_node_local(ref_node,lVar28 + uVar20,(REF_INT *)&local_598);
                          if ((uVar11 != 0) && (uVar11 != 5)) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                   ,0xb7a,"ref_part_scalar_sol",(ulong)uVar11,"local");
                            local_5c0 = (char *)(ulong)uVar11;
                          }
                          uVar10 = (uint)local_5c0;
                          if ((uVar11 != 5) && (uVar11 != 0)) goto LAB_0019aed7;
                          if ((REF_INT)local_598 != -1) {
                            uVar10 = *ldim;
                            if (0 < (long)(int)uVar10) {
                              pRVar15 = *local_590;
                              lVar30 = 0;
                              do {
                                pRVar15[(int)((REF_INT)local_598 * uVar10) + lVar30] =
                                     *(REF_DBL *)
                                      (&local_5a8->_flags +
                                      (long)(int)(uVar10 * (int)uVar20) * 2 + lVar30 * 2);
                                lVar30 = lVar30 + 1;
                              } while ((int)uVar10 != lVar30);
                            }
                          }
                          if ((uint)local_5a0 == 2) {
                            uVar10 = ref_node_local(ref_node,(long)&local_5b0->n + lVar28 + uVar20,
                                                    (REF_INT *)&local_598);
                            if ((uVar10 != 0) && (uVar10 != 5)) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                     ,0xb82,"ref_part_scalar_sol",(ulong)uVar10,"local");
                              local_5c0 = (char *)(ulong)uVar10;
                            }
                            if ((uVar10 != 5) && (uVar10 != 0)) goto LAB_0019a890;
                            if ((REF_INT)local_598 != -1) {
                              uVar10 = *ldim;
                              if (0 < (long)(int)uVar10) {
                                pRVar15 = *local_590;
                                lVar30 = 0;
                                do {
                                  pRVar15[(int)((REF_INT)local_598 * uVar10) + lVar30] =
                                       *(REF_DBL *)
                                        (&local_5a8->_flags +
                                        (long)(int)((int)uVar20 * uVar10) * 2 + lVar30 * 2);
                                  lVar30 = lVar30 + 1;
                                } while ((int)uVar10 != lVar30);
                              }
                            }
                          }
                          uVar10 = (uint)local_5c0;
                          uVar20 = uVar20 + 1;
                        } while (uVar20 != uVar23);
                      }
                      lVar28 = lVar28 + (int)local_588;
                      local_5c0 = (char *)(ulong)uVar10;
                      pFVar16 = local_5a8;
                    } while (lVar28 < (long)local_5b0);
                  }
                  if (pFVar16 != (FILE *)0x0) {
                    free(pFVar16);
                  }
                  if ((ref_node->ref_mpi->id == 0) && (iVar9 = fclose(local_5b8), iVar9 != 0)) {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0xb90,"ref_part_scalar_sol","close file",0,(long)iVar9);
                    local_5c0 = (char *)0x1;
                  }
                  else {
                    local_5c0 = (char *)0x0;
                  }
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0xb53,"ref_part_scalar_sol",(ulong)uVar10,"bcast dim");
                local_5c0 = (char *)(ulong)uVar10;
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0xb52,"ref_part_scalar_sol",(ulong)uVar10,"bcast ldim");
              local_5c0 = (char *)(ulong)uVar10;
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0xb51,"ref_part_scalar_sol",(ulong)uVar10,"bcast nnode");
            local_5c0 = (char *)(ulong)uVar10;
          }
        }
LAB_0019a890:
        if ((int)local_5c0 == 0) {
          return 0;
        }
        pcVar25 = "sol failed";
        uVar21 = 0xcbe;
      }
    }
  }
  else {
    if (ref_grid->mpi->n < 2) {
      ref_cell = ref_grid->cell[3];
      local_590 = scalar;
      pFVar16 = fopen(filename,"r");
      if (pFVar16 == (FILE *)0x0) {
        printf("unable to open %s\n",filename);
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0xa82,"ref_part_scalar_cell_restart_sol","unable to open file");
        local_5c0 = (char *)0x2;
      }
      else {
        *ldim = 5;
        iVar9 = __isoc99_fscanf(pFVar16,"%d",&local_570);
        if (iVar9 != 1) {
          pcVar25 = "read ncell";
          uVar26 = 1;
          uVar21 = 0xa85;
LAB_00198d98:
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 uVar21,"ref_part_scalar_cell_restart_sol",pcVar25,uVar26,(long)iVar9);
          goto LAB_00198d9f;
        }
        if ((uint)local_570 != ref_cell->n) {
          printf("file %d ref_cell %d\n");
          pcVar25 = "ERROR: global count mismatch";
          uVar21 = 0xa88;
          goto LAB_001975c3;
        }
        uVar10 = ref_node->max * *ldim;
        if ((int)uVar10 < 0) {
          local_560 = (uint *)ldim;
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0xa8b,"ref_part_scalar_cell_restart_sol","malloc *scalar of REF_DBL negative");
          local_5c0 = (char *)0x1;
LAB_001997a5:
          bVar31 = false;
        }
        else {
          local_560 = (uint *)ldim;
          pRVar15 = (REF_DBL *)malloc((ulong)uVar10 << 3);
          *local_590 = pRVar15;
          if (pRVar15 == (REF_DBL *)0x0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0xa8b,"ref_part_scalar_cell_restart_sol","malloc *scalar of REF_DBL NULL");
            local_5c0 = (char *)0x2;
            goto LAB_001997a5;
          }
          bVar31 = true;
          if (uVar10 != 0) {
            memset(pRVar15,0,(ulong)uVar10 << 3);
          }
          local_5c0 = (char *)0x1;
        }
        if (!bVar31) goto LAB_00198da5;
        iVar9 = ref_node->max;
        if ((long)iVar9 < 0) {
          local_5c0 = (char *)0x1;
          pcVar25 = "malloc hits of REF_INT negative";
LAB_001999fb:
          bVar31 = false;
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0xa8c,"ref_part_scalar_cell_restart_sol",pcVar25);
          pvVar17 = (void *)0x0;
        }
        else {
          pvVar17 = malloc((long)iVar9 * 4);
          if (pvVar17 == (void *)0x0) {
            local_5c0 = (char *)0x2;
            pcVar25 = "malloc hits of REF_INT NULL";
            goto LAB_001999fb;
          }
          bVar31 = true;
          if (iVar9 != 0) {
            lVar28 = 0;
            do {
              *(undefined4 *)((long)pvVar17 + lVar28 * 4) = 0;
              lVar28 = lVar28 + 1;
            } while (lVar28 < ref_node->max);
          }
        }
        if (bVar31) {
          if (0 < ref_cell->max) {
            iVar9 = 0;
            do {
              RVar12 = ref_cell_nodes(ref_cell,iVar9,(REF_INT *)&local_518);
              if (RVar12 == 0) {
                iVar22 = __isoc99_fscanf(pFVar16,"%lf %lf %lf %lf",&local_5b0,&local_598,&local_5a0,
                                         &local_578);
                if (iVar22 != 4) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0xa91,"ref_part_scalar_cell_restart_sol","cell data read",4,(long)iVar22);
                  local_5c0 = (char *)0x1;
                  goto LAB_00198da5;
                }
                if (0 < ref_cell->node_per) {
                  pRVar15 = *local_590;
                  uVar10 = *local_560;
                  lVar28 = 0;
                  do {
                    lVar30 = (long)*(int *)((long)&local_518 + lVar28 * 4);
                    lVar24 = lVar30 * (int)uVar10;
                    pRVar15[lVar24] = (double)local_5b0 + pRVar15[lVar24];
                    pRVar15[lVar24 + 1] = (double)local_598 + pRVar15[lVar24 + 1];
                    pRVar15[lVar24 + 3] = (double)local_5a0 + pRVar15[lVar24 + 3];
                    pRVar15[lVar24 + 4] = (double)local_578 + pRVar15[lVar24 + 4];
                    piVar1 = (int *)((long)pvVar17 + lVar30 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar28 = lVar28 + 1;
                  } while (lVar28 < ref_cell->node_per);
                }
              }
              iVar9 = iVar9 + 1;
            } while (iVar9 < ref_cell->max);
          }
          iVar9 = ref_node->max;
          if (0 < (long)iVar9) {
            pRVar5 = ref_node->global;
            lVar28 = 0;
            do {
              if (-1 < pRVar5[lVar28]) {
                iVar22 = *(int *)((long)pvVar17 + lVar28 * 4);
                if (iVar22 < 1) {
                  pcVar25 = "zero hits for node";
                  uVar21 = 0xa9c;
                  goto LAB_001975c3;
                }
                lVar30 = (long)(int)lVar28 * (long)(int)*local_560;
                pRVar15 = *local_590;
                lVar24 = 0;
                do {
                  pRVar15[lVar30 + lVar24] = pRVar15[lVar30 + lVar24] / (double)iVar22;
                  lVar24 = lVar24 + 1;
                } while (lVar24 != 5);
              }
              lVar28 = lVar28 + 1;
            } while (lVar28 != iVar9);
          }
          if (pvVar17 != (void *)0x0) {
            free(pvVar17);
          }
          iVar9 = fclose(pFVar16);
          if (iVar9 != 0) {
            pcVar25 = "close file";
            uVar21 = 0xaa3;
            uVar26 = 0;
            goto LAB_00198d98;
          }
          local_5c0 = (char *)0x0;
        }
      }
    }
    else {
      pcVar25 = "only implemented for single core";
      uVar21 = 0xa7e;
LAB_001975c3:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar21
             ,"ref_part_scalar_cell_restart_sol",pcVar25);
LAB_00198d9f:
      local_5c0 = (char *)0x1;
    }
LAB_00198da5:
    if ((int)local_5c0 == 0) {
      return 0;
    }
    pcVar25 = "restart_sol failed";
    uVar21 = 0xcb6;
  }
  RVar12 = (REF_STATUS)local_5c0;
LAB_0019b232:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar21,
         "ref_part_scalar",local_5c0,pcVar25);
  return RVar12;
LAB_0019aed7:
  local_5c0 = (char *)(ulong)uVar10;
  goto LAB_0019a890;
}

Assistant:

REF_FCN REF_STATUS ref_part_scalar(REF_GRID ref_grid, REF_INT *ldim,
                                   REF_DBL **scalar, const char *filename) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  size_t end_of_string;

  end_of_string = strlen(filename);

  if (end_of_string > 12 &&
      strcmp(&filename[end_of_string - 12], ".restart_sol") == 0) {
    RSS(ref_part_scalar_cell_restart_sol(ref_grid, ldim, scalar, filename),
        "restart_sol failed");
    return REF_SUCCESS;
  }
  if (end_of_string > 4 && strcmp(&filename[end_of_string - 4], ".rst") == 0) {
    RSS(ref_part_scalar_rst(ref_node, ldim, scalar, filename), "rst failed");
    return REF_SUCCESS;
  }
  if (end_of_string > 4 && strcmp(&filename[end_of_string - 4], ".sol") == 0) {
    RSS(ref_part_scalar_sol(ref_node, ldim, scalar, filename), "sol failed");
    return REF_SUCCESS;
  }
  if (end_of_string > 5 && strcmp(&filename[end_of_string - 5], ".solb") == 0) {
    RSS(ref_part_scalar_solb(ref_node, ldim, scalar, filename), "solb failed");
    return REF_SUCCESS;
  }
  if (end_of_string > 5 && strcmp(&filename[end_of_string - 5], ".snap") == 0) {
    RSS(ref_part_scalar_snap(ref_node, ldim, scalar, filename), "snap failed");
    return REF_SUCCESS;
  }
  if (end_of_string > 4 && strcmp(&filename[end_of_string - 4], ".plt") == 0) {
    RSS(ref_part_scalar_plt(ref_grid, ldim, scalar, filename), "snap failed");
    return REF_SUCCESS;
  }

  printf("%s: %d: %s %s\n", __FILE__, __LINE__,
         "input file name extension unknown", filename);
  RSS(REF_FAILURE, "unknown file extension");
  return REF_FAILURE;
}